

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O3

vector<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_> * __thiscall
wallet::anon_unknown_5::WalletImpl::getCoins
          (vector<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_>
           *__return_storage_ptr__,WalletImpl *this,
          vector<COutPoint,_std::allocator<COutPoint>_> *outputs)

{
  CScript *pCVar1;
  prevector<28U,_unsigned_char,_unsigned_int,_int> *other;
  uint32_t uVar2;
  key_type *pkVar3;
  CWallet *this_00;
  long lVar4;
  pointer pWVar5;
  int iVar6;
  iterator iVar7;
  int64_t iVar8;
  uchar *__k;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::recursive_mutex>_> criticalblock30;
  unique_lock<std::recursive_mutex> local_b0;
  CTxOut local_a0;
  undefined5 local_78;
  undefined3 uStack_73;
  int local_70;
  undefined1 local_6c;
  COutPoint local_68;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_b0._M_device =
       &(((this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
        cs_wallet).super_recursive_mutex;
  local_b0._M_owns = false;
  std::unique_lock<std::recursive_mutex>::lock(&local_b0);
  (__return_storage_ptr__->
  super__Vector_base<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  _GLOBAL__N_1::std::vector<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_>::
  reserve(__return_storage_ptr__,
          (*(long *)(outputs + 8) - *(long *)outputs >> 2) * -0x71c71c71c71c71c7);
  pkVar3 = *(key_type **)(outputs + 8);
  for (__k = *(uchar **)outputs; (key_type *)__k != pkVar3; __k = __k + 0x24) {
    _GLOBAL__N_1::std::vector<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_>::
    emplace_back<>(__return_storage_ptr__);
    iVar7 = _GLOBAL__N_1::std::
            _Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
            ::find((_Hashtable<uint256,_std::pair<const_uint256,_wallet::CWalletTx>,_std::allocator<std::pair<const_uint256,_wallet::CWalletTx>_>,_std::__detail::_Select1st,_std::equal_to<uint256>,_SaltedTxidHasher,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>_>
                    *)&((this->m_wallet).
                        super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                       mapWallet,(key_type *)__k);
    if (iVar7.super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>._M_cur !=
        (__node_type *)0x0) {
      iVar6 = CWallet::GetTxDepthInMainChain
                        ((this->m_wallet).
                         super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                         (CWalletTx *)
                         ((long)iVar7.
                                super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                ._M_cur + 0x28));
      if (-1 < iVar6) {
        this_00 = (this->m_wallet).super___shared_ptr<wallet::CWallet,_(__gnu_cxx::_Lock_policy)2>.
                  _M_ptr;
        uVar2 = *(uint32_t *)(((key_type *)(__k + 0x20))->super_base_blob<256U>).m_data._M_elems;
        CTxOut::CTxOut(&local_a0);
        local_70 = 0xffffffff;
        local_6c = 0;
        other = (prevector<28U,_unsigned_char,_unsigned_int,_int> *)
                (*(long *)(*(long *)((long)iVar7.
                                           super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                           ._M_cur + 0x1c0) + 0x18) + 8 + (long)(int)uVar2 * 0x28);
        local_a0.nValue = *(CAmount *)((long)&other[-1]._union + 0x18);
        prevector<28U,_unsigned_char,_unsigned_int,_int>::operator=
                  (&local_a0.scriptPubKey.super_CScriptBase,other);
        iVar8 = CWalletTx::GetTxTime
                          ((CWalletTx *)
                           ((long)iVar7.
                                  super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                  ._M_cur + 0x28));
        local_78 = (undefined5)iVar8;
        uStack_73 = (undefined3)((ulong)iVar8 >> 0x28);
        lVar4 = *(long *)((long)iVar7.
                                super__Node_iterator_base<std::pair<const_uint256,_wallet::CWalletTx>,_true>
                                ._M_cur + 0x1c0);
        local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._0_8_ =
             *(undefined8 *)(lVar4 + 0x39);
        local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._8_8_ =
             *(undefined8 *)(lVar4 + 0x41);
        local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._16_8_ =
             *(undefined8 *)(lVar4 + 0x49);
        local_68.hash.m_wrapped.super_base_blob<256U>.m_data._M_elems._24_8_ =
             *(undefined8 *)(lVar4 + 0x51);
        local_70 = iVar6;
        local_68.n = uVar2;
        local_6c = CWallet::IsSpent(this_00,&local_68);
        pWVar5 = (__return_storage_ptr__->
                 super__Vector_base<interfaces::WalletTxOut,_std::allocator<interfaces::WalletTxOut>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
        pWVar5[-1].txout.nValue = local_a0.nValue;
        pCVar1 = &pWVar5[-1].txout.scriptPubKey;
        if (0x1c < pWVar5[-1].txout.scriptPubKey.super_CScriptBase._size) {
          free((pCVar1->super_CScriptBase)._union.indirect_contents.indirect);
        }
        *(ulong *)((long)&pWVar5[-1].txout.scriptPubKey.super_CScriptBase._union + 0xc) =
             CONCAT44(local_a0.scriptPubKey.super_CScriptBase._union._16_4_,
                      local_a0.scriptPubKey.super_CScriptBase._union._12_4_);
        *(undefined8 *)((long)&pWVar5[-1].txout.scriptPubKey.super_CScriptBase._union + 0x14) =
             local_a0.scriptPubKey.super_CScriptBase._union._20_8_;
        (pCVar1->super_CScriptBase)._union.indirect_contents.indirect =
             local_a0.scriptPubKey.super_CScriptBase._union.indirect_contents.indirect;
        *(ulong *)((long)&pWVar5[-1].txout.scriptPubKey.super_CScriptBase._union + 8) =
             CONCAT44(local_a0.scriptPubKey.super_CScriptBase._union._12_4_,
                      local_a0.scriptPubKey.super_CScriptBase._union.indirect_contents.capacity);
        pWVar5[-1].txout.scriptPubKey.super_CScriptBase._size =
             local_a0.scriptPubKey.super_CScriptBase._size;
        *(ulong *)((long)&pWVar5[-1].time + 5) = CONCAT17(local_6c,CONCAT43(local_70,uStack_73));
        pWVar5[-1].time = CONCAT35(uStack_73,local_78);
        local_a0.scriptPubKey.super_CScriptBase._size = 0;
      }
    }
  }
  std::unique_lock<std::recursive_mutex>::~unique_lock(&local_b0);
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<WalletTxOut> getCoins(const std::vector<COutPoint>& outputs) override
    {
        LOCK(m_wallet->cs_wallet);
        std::vector<WalletTxOut> result;
        result.reserve(outputs.size());
        for (const auto& output : outputs) {
            result.emplace_back();
            auto it = m_wallet->mapWallet.find(output.hash);
            if (it != m_wallet->mapWallet.end()) {
                int depth = m_wallet->GetTxDepthInMainChain(it->second);
                if (depth >= 0) {
                    result.back() = MakeWalletTxOut(*m_wallet, it->second, output.n, depth);
                }
            }
        }
        return result;
    }